

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall
VariationalBayesEstimatorOnLDA::~VariationalBayesEstimatorOnLDA
          (VariationalBayesEstimatorOnLDA *this)

{
  ~VariationalBayesEstimatorOnLDA(this);
  operator_delete(this);
  return;
}

Assistant:

VariationalBayesEstimatorOnLDA::~VariationalBayesEstimatorOnLDA(){//{{{

}